

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::DoMatch(RE2 *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  Arg **ppAVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  LogMessage *submatch;
  LogMessage *pLVar5;
  long lVar6;
  uint nsubmatch;
  StringPiece stkvec [17];
  LogMessage *local_1d8;
  Arg **local_1c0;
  LogMessage local_1b8;
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ == true) {
      LogMessage::LogMessage
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x326
                 ,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8.str_,"Invalid RE2: ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8.str_,(this->error_->_M_dataplus)._M_p,
                 this->error_->_M_string_length);
      LogMessage::~LogMessage(&local_1b8);
    }
    return false;
  }
  lVar6 = 8;
  do {
    *(undefined8 *)((long)&local_1c0 + lVar6) = 0;
    *(undefined4 *)((long)&local_1b8.severity_ + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x118);
  nsubmatch = n + 1U;
  if (n == 0) {
    nsubmatch = 0;
  }
  if (consumed != (int *)0x0) {
    nsubmatch = n + 1U;
  }
  local_1c0 = args;
  if ((int)nsubmatch < 0x12) {
    submatch = &local_1b8;
    local_1d8 = (LogMessage *)0x0;
  }
  else {
    submatch = (LogMessage *)operator_new__((ulong)nsubmatch * 0x10);
    pLVar5 = submatch;
    do {
      pLVar5->severity_ = 0;
      pLVar5->flushed_ = false;
      *(undefined3 *)&pLVar5->field_0x5 = 0;
      *(undefined4 *)&pLVar5->str_ = 0;
      pLVar5 = (LogMessage *)&pLVar5->field_0x10;
      local_1d8 = submatch;
    } while (pLVar5 != (LogMessage *)(&submatch->severity_ + (ulong)nsubmatch * 4));
  }
  bVar2 = Match(this,text,0,text->length_,anchor,(StringPiece *)submatch,nsubmatch);
  ppAVar1 = local_1c0;
  if (bVar2) {
    if (consumed != (int *)0x0) {
      *consumed = (submatch->severity_ + *(int *)&submatch->str_) - *(int *)&text->ptr_;
    }
    if (local_1c0 != (Arg **)0x0 && n != 0) {
      iVar4 = NumberOfCapturingGroups(this);
      if (iVar4 < n) goto LAB_001316bc;
      if (0 < n) {
        lVar6 = 0;
        do {
          cVar3 = (*(code *)(*(undefined8 **)((long)ppAVar1 + lVar6))[1])
                            (*(undefined8 *)(&submatch->field_0x10 + lVar6 * 2),
                             *(undefined4 *)(&submatch->field_0x18 + lVar6 * 2),
                             **(undefined8 **)((long)ppAVar1 + lVar6));
          if (cVar3 == '\0') {
            if (local_1d8 == (LogMessage *)0x0) {
              return false;
            }
            operator_delete__(local_1d8);
            return false;
          }
          lVar6 = lVar6 + 8;
        } while ((ulong)(uint)n << 3 != lVar6);
      }
    }
    bVar2 = true;
  }
  else {
LAB_001316bc:
    bVar2 = false;
  }
  if (local_1d8 != (LogMessage *)0x0) {
    operator_delete__(local_1d8);
  }
  return bVar2;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor anchor,
                  int* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= arraysize(stkvec)) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<int>(vec[0].end() - text.begin());

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  int ncap = NumberOfCapturingGroups();
  if (ncap < n) {
    // RE has fewer capturing groups than number of arg pointers passed in
    VLOG(1) << "Asked for " << n << " but only have " << ncap;
    delete[] heapvec;
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      VLOG(1) << "Parse error on #" << i << " " << s << " "
              << (void*)s.data() << "/" << s.size();
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}